

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall
QL_Manager::Delete(QL_Manager *this,char *relName,int nConditions,Condition *conditions)

{
  char *pcVar1;
  int iVar2;
  QL_Manager *this_00;
  RC RVar3;
  size_t sVar4;
  ostream *poVar5;
  RelCatEntry *pRVar6;
  AttrCatEntry *aEntry;
  long lVar7;
  long lVar8;
  Condition *c;
  AttrCatEntry *pAVar9;
  QL_Manager *this_01;
  ulong uVar10;
  QL_Node *topNode;
  QL_Node *local_48;
  char *local_40;
  QL_Manager *local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Delete\n",7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   relName = ",0xd);
  local_38 = this;
  if (relName == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x12b1d0);
  }
  else {
    sVar4 = strlen(relName);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,relName,sVar4);
  }
  local_40 = relName;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   nCondtions = ",0x10);
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,nConditions);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (0 < nConditions) {
    uVar10 = 0;
    c = conditions;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"   conditions[",0xe)
      ;
      poVar5 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]:",2);
      poVar5 = operator<<(poVar5,c);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      uVar10 = uVar10 + 1;
      c = c + 1;
    } while ((uint)nConditions != uVar10);
  }
  this_00 = local_38;
  Reset(local_38);
  this_00->condptr = conditions;
  this_00->nConds = nConditions;
  pRVar6 = (RelCatEntry *)malloc(0x34);
  this_00->relEntries = pRVar6;
  pRVar6->relName[0] = '\0';
  pRVar6->relName[1] = '\0';
  pRVar6->relName[2] = '\0';
  pRVar6->relName[3] = '\0';
  pRVar6->relName[4] = '\0';
  pRVar6->relName[5] = '\0';
  pRVar6->relName[6] = '\0';
  pRVar6->relName[7] = '\0';
  pRVar6->relName[8] = '\0';
  pRVar6->relName[9] = '\0';
  pRVar6->relName[10] = '\0';
  pRVar6->relName[0xb] = '\0';
  pRVar6->relName[0xc] = '\0';
  pRVar6->relName[0xd] = '\0';
  pRVar6->relName[0xe] = '\0';
  pRVar6->relName[0xf] = '\0';
  pRVar6->relName[9] = '\0';
  pRVar6->relName[10] = '\0';
  pRVar6->relName[0xb] = '\0';
  pRVar6->relName[0xc] = '\0';
  pRVar6->relName[0xd] = '\0';
  pRVar6->relName[0xe] = '\0';
  pRVar6->relName[0xf] = '\0';
  pRVar6->relName[0x10] = '\0';
  pRVar6->relName[0x11] = '\0';
  pRVar6->relName[0x12] = '\0';
  pRVar6->relName[0x13] = '\0';
  pRVar6->relName[0x14] = '\0';
  pRVar6->relName[0x15] = '\0';
  pRVar6->relName[0x16] = '\0';
  pRVar6->relName[0x17] = '\0';
  pRVar6->relName[0x18] = '\0';
  pRVar6->tupleLength = 0;
  pRVar6->attrCount = 0;
  pRVar6->indexCount = 0;
  pRVar6->indexCurrNum = 0;
  pRVar6->numTuples = 0;
  pRVar6->statsInitialized = false;
  *(undefined3 *)&pRVar6->field_0x31 = 0;
  pRVar6->statsInitialized = true;
  RVar3 = SetUpOneRelation(this_00,local_40);
  pAVar9 = (AttrCatEntry *)this_00->relEntries;
  if (RVar3 == 0) {
    iVar2 = *(int *)(pAVar9->attrName + 7);
    aEntry = (AttrCatEntry *)malloc((long)iVar2 * 0x54);
    this_00->attrEntries = aEntry;
    aEntry->relName[0] = '\0';
    aEntry->relName[1] = '\0';
    aEntry->relName[2] = '\0';
    aEntry->relName[3] = '\0';
    aEntry->relName[4] = '\0';
    aEntry->relName[5] = '\0';
    aEntry->relName[6] = '\0';
    aEntry->relName[7] = '\0';
    aEntry->relName[8] = '\0';
    aEntry->relName[9] = '\0';
    aEntry->relName[10] = '\0';
    aEntry->relName[0xb] = '\0';
    aEntry->relName[0xc] = '\0';
    aEntry->relName[0xd] = '\0';
    aEntry->relName[0xe] = '\0';
    aEntry->relName[0xf] = '\0';
    aEntry->relName[0x10] = '\0';
    aEntry->relName[0x11] = '\0';
    aEntry->relName[0x12] = '\0';
    aEntry->relName[0x13] = '\0';
    aEntry->relName[0x14] = '\0';
    aEntry->relName[0x15] = '\0';
    aEntry->relName[0x16] = '\0';
    aEntry->relName[0x17] = '\0';
    *(undefined8 *)(aEntry->relName + 0x18) = 0;
    aEntry->attrName[7] = '\0';
    aEntry->attrName[8] = '\0';
    aEntry->attrName[9] = '\0';
    aEntry->attrName[10] = '\0';
    aEntry->attrName[0xb] = '\0';
    aEntry->attrName[0xc] = '\0';
    aEntry->attrName[0xd] = '\0';
    aEntry->attrName[0xe] = '\0';
    aEntry->attrName[0xf] = '\0';
    aEntry->attrName[0x10] = '\0';
    aEntry->attrName[0x11] = '\0';
    aEntry->attrName[0x12] = '\0';
    aEntry->attrName[0x13] = '\0';
    aEntry->attrName[0x14] = '\0';
    aEntry->attrName[0x15] = '\0';
    aEntry->attrName[0x16] = '\0';
    *(undefined8 *)(aEntry->attrName + 0x17) = 0;
    aEntry->attrType = INT;
    aEntry->attrLength = 0;
    aEntry->indexNo = 0;
    aEntry->attrNum = 0;
    aEntry->numDistinct = 0;
    aEntry->maxValue = 0.0;
    aEntry->minValue = 0.0;
    if (0 < (long)iVar2) {
      lVar7 = 0x4c;
      lVar8 = 0;
      do {
        pAVar9 = this_00->attrEntries;
        pcVar1 = pAVar9->relName + lVar7 + -0x2c;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pcVar1 = pAVar9->relName + lVar7 + -0x3c;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pcVar1 = pAVar9->relName + lVar7 + -0x4c;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        (pAVar9->relName + lVar7 + -0x1c)[0] = '\0';
        (pAVar9->relName + lVar7 + -0x1c)[1] = '\0';
        pcVar1 = pAVar9->relName + lVar7 + -0x18;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1[8] = '\0';
        pcVar1[9] = '\0';
        pcVar1[10] = '\0';
        pcVar1[0xb] = '\0';
        pcVar1[0xc] = '\0';
        pcVar1[0xd] = '\0';
        pcVar1[0xe] = '\0';
        pcVar1[0xf] = '\0';
        pcVar1 = pAVar9->relName + lVar7 + -8;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = '\0';
        pcVar1[3] = '\0';
        pcVar1[4] = '\0';
        pcVar1[5] = '\0';
        pcVar1[6] = '\0';
        pcVar1[7] = '\0';
        pcVar1 = pAVar9->relName + lVar7;
        pcVar1[0] = '\0';
        pcVar1[1] = '\0';
        pcVar1[2] = -0x80;
        pcVar1[3] = '\0';
        pcVar1[4] = -1;
        pcVar1[5] = -1;
        pcVar1[6] = '\x7f';
        pcVar1[7] = '\x7f';
        lVar8 = lVar8 + 1;
        pAVar9 = (AttrCatEntry *)this_00->relEntries;
        lVar7 = lVar7 + 0x54;
      } while (lVar8 < *(int *)(pAVar9->attrName + 7));
      aEntry = this_00->attrEntries;
    }
    RVar3 = SM_Manager::GetAttrForRel(this_00->smm,(RelCatEntry *)pAVar9,aEntry,&this_00->attrToRel)
    ;
    if ((RVar3 == 0) && (RVar3 = ParseConditions(this_00,nConditions,conditions), RVar3 == 0)) {
      RVar3 = SetUpFirstNode(this_00,&local_48);
      if (RVar3 != 0) {
        return RVar3;
      }
      if (bQueryPlans != 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"PRINTING QUERY PLAN",0x13);
        std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
        (*local_48->_vptr_QL_Node[5])(local_48,0);
      }
      this_01 = this_00;
      RVar3 = RunDelete(this_00,local_48);
      if (RVar3 != 0) {
        return RVar3;
      }
      RVar3 = CleanUpNodes(this_01,local_48);
      if (RVar3 != 0) {
        return RVar3;
      }
      free(this_00->relEntries);
      free(this_00->attrEntries);
      return 0;
    }
    free(this_00->relEntries);
    pAVar9 = this_00->attrEntries;
  }
  free(pAVar9);
  return RVar3;
}

Assistant:

RC QL_Manager::Delete(const char *relName,
                      int nConditions, const Condition conditions[])
{
  int i;

  cout << "Delete\n";

  cout << "   relName = " << relName << "\n";
  cout << "   nCondtions = " << nConditions << "\n";
  for (i = 0; i < nConditions; i++)
    cout << "   conditions[" << i << "]:" << conditions[i] << "\n";

  RC rc = 0;
  Reset();
  condptr = conditions;
  nConds = nConditions;
  
  // Make space for relation 
  relEntries = (RelCatEntry *)malloc(sizeof(RelCatEntry));
  memset((void*)relEntries, 0, sizeof(*relEntries));
  *relEntries = (RelCatEntry) {"\0", 0, 0, 0, 0, 0, true};
  if((rc = SetUpOneRelation(relName))){
    free(relEntries);
    return (rc);
  }
  // Make space for the list of attributes in this relation
  attrEntries = (AttrCatEntry *)malloc(relEntries->attrCount * sizeof(AttrCatEntry));
  memset((void*)attrEntries, 0, sizeof(*attrEntries));
  for(int i= 0 ; i < relEntries->attrCount; i++){
    *(attrEntries+i) = (AttrCatEntry) {"\0", "\0", 0, INT, 0, 0, 0, 0, FLT_MIN, FLT_MAX};
  }
  if((rc = smm.GetAttrForRel(relEntries, attrEntries, attrToRel))){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

  // Makes sure that the conditions are appropriate
  if(rc = ParseConditions(nConditions, conditions)){
    free(relEntries);
    free(attrEntries);
    return (rc);
  }

   // Create the query tree nodes
    QL_Node *topNode;
    if((rc = SetUpFirstNode(topNode)))
    return (rc);

  // Print the query plan
  if(bQueryPlans){
    cout << "PRINTING QUERY PLAN" <<endl;
    topNode->PrintNode(0);
  }
  
  if((rc = RunDelete(topNode))) // Run delete
    return (rc);
  
  if(rc = CleanUpNodes(topNode)) // Clean up the nodes
    return (rc);

  free(relEntries);
  free(attrEntries);

  return 0;
}